

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkSamplerCustomBorderColorCreateInfoEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSamplerCustomBorderColorCreateInfoEXT>
          (Impl *this,VkSamplerCustomBorderColorCreateInfoEXT *src,size_t count,
          ScratchAllocator *alloc)

{
  VkSamplerCustomBorderColorCreateInfoEXT *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkSamplerCustomBorderColorCreateInfoEXT *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkSamplerCustomBorderColorCreateInfoEXT>
                                   (alloc,count);
    if (this_local != (Impl *)0x0) {
      std::
      copy<VkSamplerCustomBorderColorCreateInfoEXT_const*,VkSamplerCustomBorderColorCreateInfoEXT*>
                (src,src + count,(VkSamplerCustomBorderColorCreateInfoEXT *)this_local);
    }
  }
  return (VkSamplerCustomBorderColorCreateInfoEXT *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}